

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_test_fixture.cpp
# Opt level: O0

void __thiscall
wallet::InitWalletDirTestingSetup::SetWalletDir
          (InitWalletDirTestingSetup *this,path *walletdir_path)

{
  long lVar1;
  path *path;
  long in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  ArgsManager *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  path = (path *)(in_RDI + 0x1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
             (allocator<char> *)in_stack_ffffffffffffffb8);
  fs::PathToString_abi_cxx11_(path);
  ArgsManager::ForceSetArg
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InitWalletDirTestingSetup::SetWalletDir(const fs::path& walletdir_path)
{
    m_args.ForceSetArg("-walletdir", fs::PathToString(walletdir_path));
}